

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppmb_io.cpp
# Opt level: O0

bool ppmb_write_test(string *file_name)

{
  string local_68;
  int local_48;
  int local_44;
  int ysize;
  int xsize;
  uchar *r;
  uchar *puStack_30;
  int maxrgb;
  uchar *g;
  uchar *puStack_20;
  bool error;
  uchar *b;
  string *file_name_local;
  
  local_44 = 200;
  local_48 = 200;
  b = (uchar *)file_name;
  _ysize = (uchar *)operator_new__(40000);
  puStack_30 = (uchar *)operator_new__((long)(local_44 * local_48));
  puStack_20 = (uchar *)operator_new__((long)(local_44 * local_48));
  g._7_1_ = ppmb_example(local_44,local_48,_ysize,puStack_30,puStack_20);
  if ((bool)g._7_1_) {
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"PPMB_WRITE_TEST: Fatal error!\n");
    std::operator<<((ostream *)&std::cout,"  PPM_EXAMPLE failed.\n");
    file_name_local._7_1_ = true;
  }
  else {
    std::__cxx11::string::string((string *)&local_68,(string *)file_name);
    g._7_1_ = ppmb_write(&local_68,local_44,local_48,_ysize,puStack_30,puStack_20);
    std::__cxx11::string::~string((string *)&local_68);
    if (_ysize != (uchar *)0x0) {
      operator_delete__(_ysize);
    }
    if (puStack_30 != (uchar *)0x0) {
      operator_delete__(puStack_30);
    }
    if (puStack_20 != (uchar *)0x0) {
      operator_delete__(puStack_20);
    }
    if ((g._7_1_ & 1) == 0) {
      file_name_local._7_1_ = false;
    }
    else {
      std::operator<<((ostream *)&std::cout,"\n");
      std::operator<<((ostream *)&std::cout,"PPMB_WRITE_TEST: Fatal error!\n");
      std::operator<<((ostream *)&std::cout,"  PPMB_WRITE failed.\n");
      file_name_local._7_1_ = true;
    }
  }
  return file_name_local._7_1_;
}

Assistant:

bool ppmb_write_test ( string file_name )

//****************************************************************************80
//
//  Purpose:
//
//    PPMB_WRITE_TEST tests the binary portable pixel map write routines.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    11 April 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, string FILE_NAME, the name of the file to contain the binary
//    portable pixel map data.
//
//    Output, bool PPMB_WRITE_TEST is true if an error occurred.
//
{
  unsigned char *b;
  bool error;
  unsigned char *g;
  int maxrgb;
  unsigned char *r;
  int xsize;
  int ysize;

  xsize = 200;
  ysize = 200;
//
//  Allocate memory.
// 
  r = new unsigned char[ xsize * ysize ];
  g = new unsigned char[ xsize * ysize ];
  b = new unsigned char[ xsize * ysize ];
//
//  Set the data.
//
  error = ppmb_example ( xsize, ysize, r, g, b );

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_WRITE_TEST: Fatal error!\n";
    cout << "  PPM_EXAMPLE failed.\n";
    return true;
  }
//
//  Write the data to the file.
//
  error = ppmb_write ( file_name, xsize, ysize, r, g, b );

  delete [] r;
  delete [] g;
  delete [] b;

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_WRITE_TEST: Fatal error!\n";
    cout << "  PPMB_WRITE failed.\n";
    return true;
  }

  return false;
}